

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *tgtInfo,bool verbose,bool color)

{
  bool bVar1;
  cmake *this_00;
  cmFileTimeComparison *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator local_a79;
  string local_a78 [8];
  string message;
  undefined1 local_a38 [8];
  string targetName;
  cmDependsC checker;
  undefined1 local_468 [7];
  bool needRescanDependencies;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  validDependencies;
  undefined1 local_418 [8];
  ostringstream msg_1;
  int local_2a0;
  allocator local_299;
  int result_1;
  string dirInfoFile;
  string local_270 [7];
  bool needRescanDirInfo;
  undefined1 local_250 [8];
  ostringstream msg;
  int local_d4;
  cmFileTimeComparison *pcStack_d0;
  int result;
  cmFileTimeComparison *ftc;
  undefined1 local_c0 [7];
  bool needRescanDependInfo;
  string dependFile;
  string internalDependFile;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string dir;
  bool color_local;
  bool verbose_local;
  char *tgtInfo_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  dir.field_2._M_local_buf[0xe] = color;
  dir.field_2._M_local_buf[0xf] = verbose;
  bVar1 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccuredFlag(), bVar1)) {
    cmSystemTools::Error
              ("Target DependInfo.cmake file not found",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  CheckMultipleOutputs(this,(bool)(dir.field_2._M_local_buf[0xf] & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,tgtInfo,&local_69);
  cmsys::SystemTools::GetFilenamePath((string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dependFile.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "/depend.internal");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "/depend.make");
  ftc._7_1_ = 0;
  this_00 = cmGlobalGenerator::GetCMakeInstance
                      ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  pcVar2 = cmake::GetFileComparison(this_00);
  pcStack_d0 = pcVar2;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmFileTimeComparison::FileTimeCompare(pcVar2,pcVar3,tgtInfo,&local_d4);
  if ((!bVar1) || (local_d4 < 0)) {
    if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
      poVar4 = std::operator<<((ostream *)local_250,"Dependee \"");
      poVar4 = std::operator<<(poVar4,tgtInfo);
      poVar4 = std::operator<<(poVar4,"\" is newer than depender \"");
      poVar4 = std::operator<<(poVar4,(string *)(dependFile.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,"\".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Stdout(pcVar3);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
    }
    ftc._7_1_ = 1;
  }
  dirInfoFile.field_2._M_local_buf[0xf] = '\0';
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&result_1,pcVar3,&local_299);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  pcVar3 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)&result_1,pcVar3);
  std::__cxx11::string::operator+=((string *)&result_1,"/CMakeDirectoryInformation.cmake");
  pcVar2 = pcStack_d0;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmFileTimeComparison::FileTimeCompare(pcVar2,pcVar3,pcVar5,&local_2a0);
  if ((!bVar1) || (local_2a0 < 0)) {
    if ((dir.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      poVar4 = std::operator<<((ostream *)local_418,"Dependee \"");
      poVar4 = std::operator<<(poVar4,(string *)&result_1);
      poVar4 = std::operator<<(poVar4,"\" is newer than depender \"");
      poVar4 = std::operator<<(poVar4,(string *)(dependFile.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4,"\".");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Stdout(pcVar3);
      std::__cxx11::string::~string
                ((string *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    }
    dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
         *)local_468);
  checker.CacheFileName.field_2._M_local_buf[0xf] = '\0';
  if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
    cmDependsC::cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
    cmDepends::SetVerbose
              ((cmDepends *)((long)&targetName.field_2 + 8),
               (bool)(dir.field_2._M_local_buf[0xf] & 1));
    cmDepends::SetFileComparison((cmDepends *)((long)&targetName.field_2 + 8),pcStack_d0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmDepends::Check((cmDepends *)((long)&targetName.field_2 + 8),pcVar3,pcVar5,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)local_468);
    checker.CacheFileName.field_2._M_local_buf[0xf] = (bVar1 ^ 0xffU) & 1;
    cmDependsC::~cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
  }
  if ((((ftc._7_1_ & 1) == 0) && ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0)) &&
     (checker.CacheFileName.field_2._M_local_buf[0xf] == '\0')) {
    this_local._7_1_ = true;
  }
  else {
    cmsys::SystemTools::GetFilenameName((string *)local_a38,(string *)local_48);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)local_a38);
    std::__cxx11::string::operator=
              ((string *)local_a38,(string *)(message.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a78,"Scanning dependencies of target ",&local_a79);
    std::allocator<char>::~allocator((allocator<char> *)&local_a79);
    std::__cxx11::string::operator+=(local_a78,(string *)local_a38);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::MakefileColorEcho(0x106,pcVar3,true,(bool)(dir.field_2._M_local_buf[0xe] & 1));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ =
         ScanDependencies(this,pcVar3,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                           *)local_468);
    std::__cxx11::string::~string(local_a78);
    std::__cxx11::string::~string((string *)local_a38);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *)local_468);
  std::__cxx11::string::~string((string *)&result_1);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)(dependFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(const char* tgtInfo,
                                                       bool verbose,
                                                       bool color)
{
  // read in the target info file
  if(!this->Makefile->ReadListFile(tgtInfo) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
    }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string dir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string internalDependFile = dir + "/depend.internal";
  std::string dependFile = dir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeComparison* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileComparison();
  {
  int result;
  if(!ftc->FileTimeCompare(internalDependFile.c_str(), tgtInfo, &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Dependee \"" << tgtInfo
          << "\" is newer than depender \""
          << internalDependFile << "\"." << std::endl;
      cmSystemTools::Stdout(msg.str().c_str());
      }
    needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  {
  int result;
  if(!ftc->FileTimeCompare(internalDependFile.c_str(),
                           dirInfoFile.c_str(), &result) || result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Dependee \"" << dirInfoFile
          << "\" is newer than depender \""
          << internalDependFile << "\"." << std::endl;
      cmSystemTools::Stdout(msg.str().c_str());
      }
    needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  std::map<std::string, cmDepends::DependencyVector> validDependencies;
  bool needRescanDependencies = false;
  if (needRescanDirInfo == false)
    {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileComparison(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies = !checker.Check(dependFile.c_str(),
                                            internalDependFile.c_str(),
                                            validDependencies);
    }

  if(needRescanDependInfo || needRescanDirInfo || needRescanDependencies)
    {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(dir);
    targetName = targetName.substr(0, targetName.length()-4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(
      cmsysTerminal_Color_ForegroundMagenta |
      cmsysTerminal_Color_ForegroundBold,
      message.c_str(), true, color);

    return this->ScanDependencies(dir.c_str(), validDependencies);
    }

  // The dependencies are already up-to-date.
  return true;
}